

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_sum_rows(ggml_context *ctx,ggml_tensor *a)

{
  ggml_tensor *pgVar1;
  int64_t local_28;
  int64_t iStack_20;
  int64_t iStack_18;
  int64_t local_10;
  
  local_28 = 1;
  iStack_20 = a->ne[1];
  iStack_18 = a->ne[2];
  local_10 = a->ne[3];
  pgVar1 = ggml_new_tensor_impl(ctx,a->type,4,&local_28,(ggml_tensor *)0x0,0);
  pgVar1->op = GGML_OP_SUM_ROWS;
  pgVar1->src[0] = a;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_sum_rows(
        struct ggml_context * ctx,
        struct ggml_tensor  * a) {
    int64_t ne[GGML_MAX_DIMS] = { 1 };
    for (int i = 1; i < GGML_MAX_DIMS; ++i) {
        ne[i] = a->ne[i];
    }

    struct ggml_tensor * result = ggml_new_tensor(ctx, a->type, GGML_MAX_DIMS, ne);

    result->op     = GGML_OP_SUM_ROWS;
    result->src[0] = a;

    return result;
}